

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O2

void * mpp_osal_malloc(char *caller,size_t size)

{
  undefined8 *puVar1;
  uint uVar2;
  MppMemService *this;
  ulong uVar3;
  size_t size_00;
  void *ptr;
  AutoMutex auto_lock;
  
  this = MppMemService::get_inst();
  uVar2 = this->debug;
  uVar3 = size + 0x1f & 0xffffffffffffffe0;
  size_00 = uVar3 + 0x40;
  if ((uVar2 & 0x10) == 0) {
    size_00 = uVar3;
  }
  os_malloc(&ptr,0x20,size_00);
  if (uVar2 != 0) {
    auto_lock.mLock = this->m_lock;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    MppMemService::add_log(this,MEM_MALLOC,caller,(void *)0x0,ptr,size,size_00);
    if (ptr != (void *)0x0) {
      if ((uVar2 & 0x10) != 0) {
        *(undefined8 *)((long)ptr + 0x10) = 0xabababababababab;
        *(undefined8 *)((long)ptr + 0x18) = 0xabababababababab;
        *(undefined8 *)ptr = 0xabababababababab;
        *(undefined8 *)((long)ptr + 8) = 0xabababababababab;
        puVar1 = (undefined8 *)((long)ptr + size + 0x30);
        *puVar1 = 0xcdcdcdcdcdcdcdcd;
        puVar1[1] = 0xcdcdcdcdcdcdcdcd;
        puVar1 = (undefined8 *)((long)ptr + size + 0x20);
        *puVar1 = 0xcdcdcdcdcdcdcdcd;
        puVar1[1] = 0xcdcdcdcdcdcdcdcd;
        ptr = (void *)((long)ptr + 0x20);
      }
      MppMemService::add_node(this,caller,ptr,size);
    }
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return ptr;
}

Assistant:

void *mpp_osal_malloc(const char *caller, size_t size)
{
    MppMemService *srv = MppMemService::get_inst();
    RK_U32 debug = srv->debug;
    size_t size_align = MEM_ALIGNED(size);
    size_t size_real = (debug & MEM_EXT_ROOM) ? (size_align + 2 * MEM_ALIGN) :
                       (size_align);
    void *ptr;

    os_malloc(&ptr, MEM_ALIGN, size_real);

    if (debug) {
        AutoMutex auto_lock(srv->m_lock);
        srv->add_log(MEM_MALLOC, caller, NULL, ptr, size, size_real);

        if (ptr) {
            if (debug & MEM_EXT_ROOM) {
                ptr = (RK_U8 *)ptr + MEM_ALIGN;
                set_mem_ext_room(ptr, size);
            }

            srv->add_node(caller, ptr, size);
        }
    }

    return ptr;
}